

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FboCases::RecreateBuffersTest<16384U>::RecreateBuffersTest
          (RecreateBuffersTest<16384U> *this,Context *context,FboConfig *config,bool rebind)

{
  undefined7 in_register_00000009;
  char *__s;
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __s = "no_rebind_";
  if ((int)CONCAT71(in_register_00000009,rebind) != 0) {
    __s = "rebind_";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_81);
  FboConfig::getName_abi_cxx11_(&local_80,config);
  std::operator+(&local_40,&local_60,&local_80);
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,local_40._M_dataplus._M_p,"Recreate buffers",config)
  ;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00723368;
  this->m_rebind = rebind;
  return;
}

Assistant:

RecreateBuffersTest<Buffers>::RecreateBuffersTest (Context& context, const FboConfig& config, bool rebind)
	: FboRenderCase		(context, (string(rebind ? "rebind_" : "no_rebind_") + config.getName()).c_str(), "Recreate buffers", config)
	, m_rebind			(rebind)
{
}